

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O2

void __thiscall
wasm::ReconstructStringifyWalker::ReconstructStringifyWalker
          (ReconstructStringifyWalker *this,Module *wasm,Function *func)

{
  StringifyWalker<wasm::ReconstructStringifyWalker>::StringifyWalker
            (&this->super_StringifyWalker<wasm::ReconstructStringifyWalker>);
  this->state = NotInSeq;
  (this->sequences).
  super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequences).
  super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequences).
  super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->seqCounter = 0;
  this->instrCounter = 0;
  IRBuilder::IRBuilder(&this->existingBuilder,wasm);
  IRBuilder::IRBuilder(&this->outlinedBuilder,wasm);
  this->func = func;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .
  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .currModule = wasm;
  return;
}

Assistant:

ReconstructStringifyWalker(Module* wasm, Function* func)
    : existingBuilder(*wasm), outlinedBuilder(*wasm), func(func) {
    this->setModule(wasm);
    ODBG(std::cerr << "\nexistingBuilder: " << &existingBuilder
                   << " outlinedBuilder: " << &outlinedBuilder << "\n");
  }